

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O1

void __thiscall
trun::TestResponseProxy::Begin
          (TestResponseProxy *this,string *use_symbolName,string *use_moduleName)

{
  ILogger *pIVar1;
  string local_38;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->symbolName,use_symbolName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->moduleName,use_moduleName);
  this->assertCount = 0;
  this->errorCount = 0;
  this->testResult = kTestResult_Pass;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"TestResponseProxy","");
  pIVar1 = gnilk::Logger::GetLogger(&local_38);
  this->pLogger = pIVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  Timer::Reset(&this->timer);
  std::
  vector<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>::
  _M_erase_at_end(&(this->assertError).assertErrors,
                  (this->assertError).assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void TestResponseProxy::Begin(const std::string &use_symbolName, const std::string &use_moduleName) {
    symbolName = use_symbolName;
    moduleName = use_moduleName;
    errorCount = 0;
    assertCount = 0;
    testResult = kTestResult_Pass;
    pLogger = gnilk::Logger::GetLogger("TestResponseProxy");

    // Reset the timer
    timer.Reset();
    assertError.Reset();
}